

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifneuron.cxx
# Opt level: O2

void __thiscall IfNeuron::setParameter(IfNeuron *this)

{
  string *in_RDX;
  string *in_RSI;
  
  setParameter((IfNeuron *)&this[-1].ifneuronTheta,in_RSI,in_RDX);
  return;
}

Assistant:

void IfNeuron::setParameter(const string& name, const string& value)
{
	stringstream setting;
	if (name == "threshold") {
		setting << value;
		setting >> ifneuronTheta;
		cout << "setting threshold to " << ifneuronTheta << endl;
	}
	else if (name == "spike-height") {
		setting << value;
		setting >> ifneuronSpikeHeight;
		cout << "setting spike height to " << ifneuronSpikeHeight << endl;
	}
	else if (name== "membrane integration-mode") {
		ifneuronMembrane.setParameter("mode", value);
	}
	else if (name== "membrane starting-value") {
		ifneuronMembrane.setParameter("starting-value", value);
	}
	else
		SpikingNeuron::setParameter(name, value);
}